

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

int lua_getinfo(lua_State *L,char *what,lua_Debug *ar)

{
  long lVar1;
  long lVar2;
  StkId pSVar3;
  Proto *pPVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  Table *t;
  StkId pSVar10;
  size_t sVar11;
  byte *pbVar12;
  CallInfo *pCVar13;
  ulong uVar14;
  long lVar15;
  Table *x_;
  int local_64;
  TValue local_40;
  
  if (*what == '>') {
    pSVar10 = (StkId)((L->top).offset + -0x10);
    what = what + 1;
    (L->top).p = pSVar10;
    pCVar13 = (CallInfo *)0x0;
  }
  else {
    pCVar13 = ar->i_ci;
    pSVar10 = (pCVar13->func).p;
  }
  if (((pSVar10->val).tt_ | 0x20) == 0x66) {
    lVar15 = *(long *)pSVar10;
  }
  else {
    lVar15 = 0;
  }
  local_64 = 1;
  pbVar12 = (byte *)what;
  do {
    bVar5 = *pbVar12;
    if (bVar5 < 0x66) {
      if (bVar5 != 0x4c) {
        if (bVar5 != 0x53) {
          if (bVar5 == 0) {
            pcVar9 = strchr(what,0x66);
            if (pcVar9 != (char *)0x0) {
              pSVar3 = (L->top).p;
              *(Value *)pSVar3 = (pSVar10->val).value_;
              (pSVar3->val).tt_ = (pSVar10->val).tt_;
              (L->top).p = (StkId)((L->top).offset + 0x10);
            }
            pcVar9 = strchr(what,0x4c);
            if (pcVar9 != (char *)0x0) {
              if ((lVar15 == 0) || (*(char *)(lVar15 + 8) != '\x06')) {
                *(undefined1 *)((L->top).offset + 8) = 0;
                (L->top).p = (StkId)((L->top).offset + 0x10);
              }
              else {
                pPVar4 = *(Proto **)(lVar15 + 0x18);
                iVar7 = pPVar4->linedefined;
                t = luaH_new(L);
                pSVar10 = (L->top).p;
                *(Table **)pSVar10 = t;
                (pSVar10->val).tt_ = 'E';
                (L->top).p = (StkId)((L->top).offset + 0x10);
                if (pPVar4->lineinfo != (char *)0x0) {
                  local_40.tt_ = '\x11';
                  if (pPVar4->is_vararg == '\0') {
                    uVar8 = 0;
                  }
                  else {
                    iVar6 = (int)*pPVar4->lineinfo;
                    if (iVar6 == -0x80) {
                      iVar7 = luaG_getfuncline(pPVar4,0);
                    }
                    else {
                      iVar7 = iVar7 + iVar6;
                    }
                    uVar8 = 1;
                  }
                  if ((int)uVar8 < pPVar4->sizelineinfo) {
                    uVar14 = (ulong)uVar8;
                    do {
                      if (pPVar4->lineinfo[uVar14] == -0x80) {
                        iVar7 = luaG_getfuncline(pPVar4,(int)uVar14);
                      }
                      else {
                        iVar7 = iVar7 + pPVar4->lineinfo[uVar14];
                      }
                      luaH_setint(L,t,(long)iVar7,&local_40);
                      uVar14 = uVar14 + 1;
                    } while ((int)uVar14 < pPVar4->sizelineinfo);
                  }
                }
              }
            }
            return local_64;
          }
          goto switchD_00108cbe_caseD_6d;
        }
        if ((lVar15 == 0) || (*(char *)(lVar15 + 8) != '\x06')) {
          ar->source = "=[C]";
          ar->srclen = 4;
          ar->linedefined = -1;
          ar->lastlinedefined = -1;
          pcVar9 = "C";
        }
        else {
          lVar1 = *(long *)(lVar15 + 0x18);
          lVar2 = *(long *)(lVar1 + 0x70);
          if (lVar2 == 0) {
            ar->source = "=?";
            sVar11 = 2;
          }
          else {
            ar->source = (char *)(lVar2 + 0x18);
            sVar11 = (size_t)*(byte *)(lVar2 + 0xb);
            if (sVar11 == 0xff) {
              sVar11 = *(size_t *)(lVar2 + 0x10);
            }
          }
          ar->srclen = sVar11;
          iVar7 = *(int *)(lVar1 + 0x2c);
          ar->linedefined = iVar7;
          ar->lastlinedefined = *(int *)(lVar1 + 0x30);
          pcVar9 = "Lua";
          if (iVar7 == 0) {
            pcVar9 = "main";
          }
        }
        ar->what = pcVar9;
        luaO_chunkid(ar->short_src,ar->source,ar->srclen);
      }
    }
    else {
      switch(bVar5) {
      case 0x6c:
        iVar7 = -1;
        if ((pCVar13 != (CallInfo *)0x0) && ((pCVar13->callstatus & 2) == 0)) {
          pPVar4 = *(Proto **)((((pCVar13->func).p)->val).value_.f + 0x18);
          iVar7 = luaG_getfuncline(pPVar4,(int)((ulong)((long)(pCVar13->u).l.savedpc -
                                                       (long)pPVar4->code) >> 2) + -1);
        }
        ar->currentline = iVar7;
        break;
      case 0x6d:
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
switchD_00108cbe_caseD_6d:
        local_64 = 0;
        break;
      case 0x6e:
        if ((pCVar13 == (CallInfo *)0x0) || ((pCVar13->callstatus & 0x20) != 0)) {
          pcVar9 = (char *)0x0;
        }
        else {
          pcVar9 = funcnamefromcall(L,pCVar13->previous,&ar->name);
        }
        ar->namewhat = pcVar9;
        if (pcVar9 == (char *)0x0) {
          ar->namewhat = "";
          ar->name = (char *)0x0;
        }
        break;
      case 0x72:
        if ((pCVar13 == (CallInfo *)0x0) || ((pCVar13->callstatus & 0x100) == 0)) {
          ar->ftransfer = 0;
          ar->ntransfer = 0;
        }
        else {
          ar->ftransfer = (pCVar13->u2).transferinfo.ftransfer;
          ar->ntransfer = (pCVar13->u2).transferinfo.ntransfer;
        }
        break;
      case 0x74:
        if (pCVar13 == (CallInfo *)0x0) {
          bVar5 = 0;
        }
        else {
          bVar5 = (byte)pCVar13->callstatus & 0x20;
        }
        ar->istailcall = bVar5;
        break;
      case 0x75:
        if (lVar15 == 0) {
          ar->nups = '\0';
        }
        else {
          ar->nups = *(uchar *)(lVar15 + 10);
          if (*(char *)(lVar15 + 8) == '\x06') {
            ar->isvararg = *(char *)(*(long *)(lVar15 + 0x18) + 0xb);
            ar->nparams = *(uchar *)(*(long *)(lVar15 + 0x18) + 10);
            break;
          }
        }
        ar->nparams = '\0';
        ar->isvararg = '\x01';
        break;
      default:
        if (bVar5 != 0x66) goto switchD_00108cbe_caseD_6d;
      }
    }
    pbVar12 = pbVar12 + 1;
  } while( true );
}

Assistant:

LUA_API int lua_getinfo (lua_State *L, const char *what, lua_Debug *ar) {
  int status;
  Closure *cl;
  CallInfo *ci;
  TValue *func;
  lua_lock(L);
  if (*what == '>') {
    ci = NULL;
    func = s2v(L->top.p - 1);
    api_check(L, ttisfunction(func), "function expected");
    what++;  /* skip the '>' */
    L->top.p--;  /* pop function */
  }
  else {
    ci = ar->i_ci;
    func = s2v(ci->func.p);
    lua_assert(ttisfunction(func));
  }
  cl = ttisclosure(func) ? clvalue(func) : NULL;
  status = auxgetinfo(L, what, ar, cl, ci);
  if (strchr(what, 'f')) {
    setobj2s(L, L->top.p, func);
    api_incr_top(L);
  }
  if (strchr(what, 'L'))
    collectvalidlines(L, cl);
  lua_unlock(L);
  return status;
}